

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkDarSynch(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nWords,int fVerbose)

{
  Aig_Man_t *pAig1;
  Aig_Man_t *pAig2;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pAVar1;
  
  pAVar1 = (Abc_Ntk_t *)0x0;
  pAig1 = Abc_NtkToDar(pNtk1,0,1);
  if (pAig1 != (Aig_Man_t *)0x0) {
    pAVar1 = (Abc_Ntk_t *)0x0;
    pAig2 = Abc_NtkToDar(pNtk2,0,1);
    pMan = pAig1;
    if (pAig2 != (Aig_Man_t *)0x0) {
      pMan = Saig_Synchronize(pAig1,pAig2,nWords,fVerbose);
      Aig_ManStop(pAig1);
      Aig_ManStop(pAig2);
      if (pMan == (Aig_Man_t *)0x0) {
        return (Abc_Ntk_t *)0x0;
      }
      pAVar1 = Abc_NtkFromAigPhase(pMan);
    }
    Aig_ManStop(pMan);
  }
  return pAVar1;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarSynch( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nWords, int fVerbose )
{
    extern Aig_Man_t * Saig_Synchronize( Aig_Man_t * pAig1, Aig_Man_t * pAig2, int nWords, int fVerbose );
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan1, * pMan2, * pMan;
    pMan1 = Abc_NtkToDar( pNtk1, 0, 1 );
    if ( pMan1 == NULL )
        return NULL;
    pMan2 = Abc_NtkToDar( pNtk2, 0, 1 );
    if ( pMan2 == NULL )
    {
        Aig_ManStop( pMan1 );
        return NULL;
    }
    pMan = Saig_Synchronize( pMan1, pMan2, nWords, fVerbose );
    Aig_ManStop( pMan1 );
    Aig_ManStop( pMan2 );
    if ( pMan == NULL )
        return NULL;
    pNtkAig = Abc_NtkFromAigPhase( pMan );
//    pNtkAig->pName = Extra_UtilStrsav("miter");
//    pNtkAig->pSpec = NULL;
    Aig_ManStop( pMan );
    return pNtkAig;
}